

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall google::protobuf::EnumDescriptorProto::IsInitialized(EnumDescriptorProto *this)

{
  EnumOptions *pEVar1;
  bool bVar2;
  
  bVar2 = internal::
          AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>>
                    (&this->value_);
  if (!bVar2) {
    return false;
  }
  if (((this->_has_bits_).has_bits_[0] & 2) != 0) {
    pEVar1 = this->options_;
    bVar2 = internal::ExtensionSet::IsInitialized(&pEVar1->_extensions_);
    if (!bVar2) {
      return false;
    }
    bVar2 = internal::
            AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>>
                      (&pEVar1->uninterpreted_option_);
    if (!bVar2) {
      return false;
    }
  }
  return true;
}

Assistant:

bool EnumDescriptorProto::IsInitialized() const {
  if (!::google::protobuf::internal::AllAreInitialized(this->value())) return false;
  if (has_options()) {
    if (!this->options_->IsInitialized()) return false;
  }
  return true;
}